

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O3

int bip32_key_from_parent_path
              (ext_key *hdkey,uint32_t *child_path,size_t child_path_len,uint32_t flags,
              ext_key *key_out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  ext_key *key_out_00;
  long lVar5;
  uint flags_00;
  ulong uVar6;
  ulong uVar7;
  ext_key tmp [2];
  ext_key local_1b8 [2];
  
  iVar4 = -2;
  if ((flags < 8) &&
     ((key_out != (ext_key *)0x0 && child_path_len != 0) &&
      (child_path != (uint32_t *)0x0 && hdkey != (ext_key *)0x0))) {
    flags_00 = flags | 2;
    uVar7 = 2;
    uVar6 = 0;
    do {
      key_out_00 = local_1b8 + uVar6;
      if (3 < flags) {
        uVar1 = *(undefined8 *)hdkey->pub_key_tweak_sum;
        uVar2 = *(undefined8 *)(hdkey->pub_key_tweak_sum + 8);
        uVar3 = *(undefined8 *)(hdkey->pub_key_tweak_sum + 0x18);
        *(undefined8 *)(local_1b8[uVar6].pub_key_tweak_sum + 0x10) =
             *(undefined8 *)(hdkey->pub_key_tweak_sum + 0x10);
        *(undefined8 *)(local_1b8[uVar6].pub_key_tweak_sum + 0x18) = uVar3;
        *(undefined8 *)local_1b8[uVar6].pub_key_tweak_sum = uVar1;
        *(undefined8 *)(local_1b8[uVar6].pub_key_tweak_sum + 8) = uVar2;
      }
      if (child_path_len <= uVar7) {
        flags_00 = flags;
      }
      iVar4 = bip32_key_from_parent(hdkey,child_path[uVar7 - 2],flags_00,key_out_00);
      if (iVar4 != 0) goto LAB_001599f0;
      uVar6 = uVar6 ^ 1;
      lVar5 = uVar7 - child_path_len;
      uVar7 = uVar7 + 1;
      hdkey = key_out_00;
    } while (lVar5 != 1);
    memcpy(key_out,key_out_00,0xc0);
LAB_001599f0:
    wally_clear(local_1b8,0x180);
  }
  return iVar4;
}

Assistant:

int bip32_key_from_parent_path(const struct ext_key *hdkey,
                               const uint32_t *child_path, size_t child_path_len,
                               uint32_t flags, struct ext_key *key_out)
{
    /* Optimization: We can skip hash calculations for internal nodes */
    uint32_t derivation_flags = flags | BIP32_FLAG_SKIP_HASH;
    struct ext_key tmp[2];
    size_t i, tmp_idx = 0;
    int ret;

    if (flags & ~BIP32_ALL_DEFINED_FLAGS)
        return WALLY_EINVAL; /* These flags are not defined yet */

    if (!hdkey || !child_path || !child_path_len || !key_out)
        return WALLY_EINVAL;

    for (i = 0; i < child_path_len; ++i) {
        struct ext_key *derived = &tmp[tmp_idx];
#ifdef BUILD_ELEMENTS
        if (flags & BIP32_FLAG_KEY_TWEAK_SUM)
            memcpy(derived->pub_key_tweak_sum, hdkey->pub_key_tweak_sum, sizeof(hdkey->pub_key_tweak_sum));
#endif /* BUILD_ELEMENTS */
        if (i + 2 >= child_path_len)
            derivation_flags = flags; /* Use callers flags for the final derivations */
        ret = bip32_key_from_parent(hdkey, child_path[i], derivation_flags, derived);
        if (ret != WALLY_OK)
            break;

        hdkey = derived;    /* Derived becomes next parent */
        tmp_idx = !tmp_idx; /* Use free slot in tmp for next derived */
    }

    if (ret == WALLY_OK)
        memcpy(key_out, hdkey, sizeof(*key_out));

    wally_clear(tmp, sizeof(tmp));
    return ret;
}